

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::FocusWindow(ImGuiWindow *window)

{
  ImGuiContext *pIVar1;
  ImGuiWindow *in_RDI;
  ImGuiWindow *unaff_retaddr;
  ImGuiContext *g;
  ImGuiID local_14;
  ImGuiWindow *local_8;
  
  pIVar1 = GImGui;
  if (GImGui->NavWindow != in_RDI) {
    GImGui->NavWindow = in_RDI;
    if ((in_RDI != (ImGuiWindow *)0x0) && ((pIVar1->NavDisableMouseHover & 1U) != 0)) {
      pIVar1->NavMousePosDirty = true;
    }
    pIVar1->NavInitRequest = false;
    if (in_RDI == (ImGuiWindow *)0x0) {
      local_14 = 0;
    }
    else {
      local_14 = in_RDI->NavLastIds[0];
    }
    pIVar1->NavId = local_14;
    pIVar1->NavIdIsAlive = false;
    pIVar1->NavLayer = ImGuiNavLayer_Main;
  }
  if (in_RDI != (ImGuiWindow *)0x0) {
    local_8 = in_RDI;
    if (in_RDI->RootWindow != (ImGuiWindow *)0x0) {
      local_8 = in_RDI->RootWindow;
    }
    if (((((local_8->Flags & 0x4000000U) != 0) && (pIVar1->ActiveId != 0)) &&
        (pIVar1->ActiveIdWindow != (ImGuiWindow *)0x0)) &&
       (pIVar1->ActiveIdWindow->RootWindow != local_8)) {
      ClearActiveID();
    }
    BringWindowToFocusFront(unaff_retaddr);
    if ((local_8->Flags & 0x2000U) == 0) {
      BringWindowToDisplayFront(window);
    }
  }
  return;
}

Assistant:

void ImGui::FocusWindow(ImGuiWindow* window)
{
    ImGuiContext& g = *GImGui;

    if (g.NavWindow != window)
    {
        g.NavWindow = window;
        if (window && g.NavDisableMouseHover)
            g.NavMousePosDirty = true;
        g.NavInitRequest = false;
        g.NavId = window ? window->NavLastIds[0] : 0; // Restore NavId
        g.NavIdIsAlive = false;
        g.NavLayer = ImGuiNavLayer_Main;
        //IMGUI_DEBUG_LOG("FocusWindow(\"%s\")\n", g.FrameCount, window ? window->Name : NULL);
    }

    // Passing NULL allow to disable keyboard focus
    if (!window)
        return;

    // Move the root window to the top of the pile
    if (window->RootWindow)
        window = window->RootWindow;

    // Steal focus on active widgets
    if (window->Flags & ImGuiWindowFlags_Popup) // FIXME: This statement should be unnecessary. Need further testing before removing it..
        if (g.ActiveId != 0 && g.ActiveIdWindow && g.ActiveIdWindow->RootWindow != window)
            ClearActiveID();

    // Bring to front
    BringWindowToFocusFront(window);
    if (!(window->Flags & ImGuiWindowFlags_NoBringToFrontOnFocus))
        BringWindowToDisplayFront(window);
}